

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O1

FT_Error tt_cmap14_validate(FT_Byte *table,FT_Validator valid)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar11;
  uint uVar13;
  byte *pbVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  FT_Byte *pFVar21;
  uint uVar22;
  ulong uVar10;
  ulong uVar12;
  
  pbVar14 = table + 10;
  if (valid->limit < pbVar14) {
    ft_validator_error(valid,8);
  }
  uVar11 = *(uint *)(table + 2);
  uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  uVar12 = (ulong)uVar11;
  bVar1 = table[6];
  bVar2 = table[7];
  bVar3 = table[8];
  bVar4 = table[9];
  uVar15 = (ulong)bVar2 * 0x10000 + (ulong)bVar1 * 0x1000000 | (ulong)bVar3 << 8 | (ulong)bVar4;
  if (((uVar11 < 10) || ((ulong)((long)valid->limit - (long)table) < uVar12)) ||
     ((uVar12 - 10) / 0xb < uVar15)) {
    ft_validator_error(valid,8);
  }
  if (uVar15 != 0) {
    uVar18 = 1;
    uVar15 = 0;
    do {
      bVar5 = *pbVar14;
      bVar6 = pbVar14[1];
      bVar7 = pbVar14[2];
      uVar9 = *(uint *)(pbVar14 + 3);
      uVar13 = *(uint *)(pbVar14 + 7);
      uVar16 = (ulong)(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                      uVar9 << 0x18);
      uVar9 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
      uVar10 = (ulong)uVar9;
      if ((uVar12 <= uVar16) || (uVar11 <= uVar9)) {
        ft_validator_error(valid,8);
      }
      uVar9 = (uint)bVar7 | (uint)bVar6 << 8 | (uint)bVar5 << 0x10;
      if (uVar9 < uVar18) {
        ft_validator_error(valid,8);
      }
      if (uVar16 != 0) {
        pFVar21 = table + uVar16 + 4;
        if (valid->limit < pFVar21) {
          ft_validator_error(valid,8);
        }
        uVar18 = *(uint *)(table + uVar16);
        uVar20 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        if ((ulong)((long)valid->limit - (long)pFVar21) >> 2 < uVar20) {
          ft_validator_error(valid,8);
        }
        if (uVar20 != 0) {
          uVar19 = 0;
          uVar18 = 0;
          do {
            uVar13 = (uint)table[uVar19 * 4 + uVar16 + 6] |
                     (uint)table[uVar19 * 4 + uVar16 + 5] << 8 | (uint)pFVar21[uVar19 * 4] << 0x10;
            uVar22 = table[uVar19 * 4 + uVar16 + 7] + uVar13;
            if (0x10ffff < uVar22) {
              ft_validator_error(valid,8);
            }
            if (uVar13 < uVar18) {
              ft_validator_error(valid,8);
            }
            uVar18 = uVar22 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar20 != uVar19);
        }
      }
      if (uVar10 != 0) {
        pFVar21 = table + uVar10 + 4;
        if (valid->limit < pFVar21) {
          ft_validator_error(valid,8);
        }
        uVar18 = *(uint *)(table + uVar10);
        uVar16 = (ulong)(uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                        uVar18 << 0x18);
        if ((ulong)((long)valid->limit - (long)pFVar21) / 5 < uVar16) {
          ft_validator_error(valid,8);
        }
        if (uVar16 != 0) {
          lVar17 = 0;
          uVar20 = 0;
          do {
            bVar5 = pFVar21[lVar17];
            bVar6 = table[lVar17 + uVar10 + 5];
            bVar7 = table[lVar17 + uVar10 + 6];
            uVar8 = *(ushort *)(table + lVar17 + uVar10 + 7);
            if (0x10 < bVar5) {
              ft_validator_error(valid,8);
            }
            uVar19 = (ulong)bVar7 | (ulong)bVar5 << 0x10 | (ulong)bVar6 << 8;
            if (uVar19 < uVar20) {
              ft_validator_error(valid,8);
            }
            if ((valid->level != FT_VALIDATE_DEFAULT) &&
               ((uint)valid[1].jump_buffer[0].__jmpbuf[0] <= (uint)(ushort)(uVar8 << 8 | uVar8 >> 8)
               )) {
              ft_validator_error(valid,0x10);
            }
            uVar20 = uVar19 + 1;
            lVar17 = lVar17 + 5;
          } while (uVar16 * 5 != lVar17);
        }
      }
      pbVar14 = pbVar14 + 0xb;
      uVar18 = uVar9 + 1;
      uVar15 = uVar15 + 1;
    } while (uVar15 != ((ulong)CONCAT11(bVar3,bVar4) |
                       (ulong)bVar1 * 0x1000000 | (ulong)bVar2 * 0x10000));
  }
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_validate( FT_Byte*      table,
                      FT_Validator  valid )
  {
    FT_Byte*  p;
    FT_ULong  length;
    FT_ULong  num_selectors;


    if ( table + 2 + 4 + 4 > valid->limit )
      FT_INVALID_TOO_SHORT;

    p             = table + 2;
    length        = TT_NEXT_ULONG( p );
    num_selectors = TT_NEXT_ULONG( p );

    if ( length > (FT_ULong)( valid->limit - table ) ||
         /* length < 10 + 11 * num_selectors ? */
         length < 10                                 ||
         ( length - 10 ) / 11 < num_selectors        )
      FT_INVALID_TOO_SHORT;

    /* check selectors, they must be in increasing order */
    {
      /* we start lastVarSel at 1 because a variant selector value of 0
       * isn't valid.
       */
      FT_ULong  n, lastVarSel = 1;


      for ( n = 0; n < num_selectors; n++ )
      {
        FT_ULong  varSel    = TT_NEXT_UINT24( p );
        FT_ULong  defOff    = TT_NEXT_ULONG( p );
        FT_ULong  nondefOff = TT_NEXT_ULONG( p );


        if ( defOff >= length || nondefOff >= length )
          FT_INVALID_TOO_SHORT;

        if ( varSel < lastVarSel )
          FT_INVALID_DATA;

        lastVarSel = varSel + 1;

        /* check the default table (these glyphs should be reached     */
        /* through the normal Unicode cmap, no GIDs, just check order) */
        if ( defOff != 0 )
        {
          FT_Byte*  defp     = table + defOff;
          FT_ULong  numRanges;
          FT_ULong  i;
          FT_ULong  lastBase = 0;


          if ( defp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numRanges = TT_NEXT_ULONG( defp );

          /* defp + numRanges * 4 > valid->limit ? */
          if ( numRanges > (FT_ULong)( valid->limit - defp ) / 4 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numRanges; i++ )
          {
            FT_ULong  base = TT_NEXT_UINT24( defp );
            FT_ULong  cnt  = FT_NEXT_BYTE( defp );


            if ( base + cnt >= 0x110000UL )              /* end of Unicode */
              FT_INVALID_DATA;

            if ( base < lastBase )
              FT_INVALID_DATA;

            lastBase = base + cnt + 1U;
          }
        }

        /* and the non-default table (these glyphs are specified here) */
        if ( nondefOff != 0 )
        {
          FT_Byte*  ndp        = table + nondefOff;
          FT_ULong  numMappings;
          FT_ULong  i, lastUni = 0;


          if ( ndp + 4 > valid->limit )
            FT_INVALID_TOO_SHORT;

          numMappings = TT_NEXT_ULONG( ndp );

          /* numMappings * 5 > (FT_ULong)( valid->limit - ndp ) ? */
          if ( numMappings > ( (FT_ULong)( valid->limit - ndp ) ) / 5 )
            FT_INVALID_TOO_SHORT;

          for ( i = 0; i < numMappings; i++ )
          {
            FT_ULong  uni = TT_NEXT_UINT24( ndp );
            FT_ULong  gid = TT_NEXT_USHORT( ndp );


            if ( uni >= 0x110000UL )                     /* end of Unicode */
              FT_INVALID_DATA;

            if ( uni < lastUni )
              FT_INVALID_DATA;

            lastUni = uni + 1U;

            if ( valid->level >= FT_VALIDATE_TIGHT    &&
                 gid >= TT_VALID_GLYPH_COUNT( valid ) )
              FT_INVALID_GLYPH_ID;
          }
        }
      }
    }

    return FT_Err_Ok;
  }